

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_loader.cpp
# Opt level: O2

Ref<embree::SceneGraph::Node> __thiscall
embree::XMLLoader::loadPoints(XMLLoader *this,Ref<embree::XML> *xml,RTCGeometryType type)

{
  vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
  *this_00;
  string *psVar1;
  PointSetNode *pPVar2;
  RTCGeometryType in_ECX;
  size_t siglen;
  undefined4 in_register_00000014;
  uchar *extraout_RDX;
  uchar *extraout_RDX_00;
  uchar *extraout_RDX_01;
  uchar *sig;
  uchar *extraout_RDX_02;
  ulong uVar3;
  EVP_PKEY_CTX *pEVar4;
  uchar *in_R8;
  size_t in_R9;
  vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
  *this_01;
  Ref<embree::XML> animation;
  Ref<embree::XML> animation_1;
  Ref<embree::SceneGraph::MaterialNode> material;
  Ref<embree::XML> local_b0;
  avector<Vec3ff> local_a8;
  PointSetNode *local_88;
  allocator local_79;
  undefined8 *local_78;
  undefined1 local_70 [8];
  undefined1 local_68 [48];
  _Alloc_hider local_38;
  
  local_78 = (undefined8 *)CONCAT44(in_register_00000014,type);
  psVar1 = (string *)*local_78;
  local_38._M_p = (pointer)this;
  std::__cxx11::string::string((string *)&local_a8,"material",(allocator *)&local_b0);
  XML::child((XML *)local_68,psVar1);
  loadMaterial((XMLLoader *)(local_68 + 0x28),xml);
  if ((EVP_PKEY_CTX *)local_68._0_8_ != (EVP_PKEY_CTX *)0x0) {
    (**(code **)(*(long *)local_68._0_8_ + 0x18))();
  }
  std::__cxx11::string::~string((string *)&local_a8);
  local_88 = (PointSetNode *)::operator_new(0xb0);
  local_68._32_8_ = local_68._40_8_;
  if ((_Base_ptr)local_68._40_8_ != (_Base_ptr)0x0) {
    (**(code **)(*(long *)local_68._40_8_ + 0x10))();
  }
  pPVar2 = local_88;
  siglen = 0;
  SceneGraph::PointSetNode::PointSetNode
            (local_88,in_ECX,(Ref<embree::SceneGraph::MaterialNode> *)(local_68 + 0x20),
             (BBox1f)0x3f80000000000000,0);
  (*(pPVar2->super_Node).super_RefCount._vptr_RefCount[2])(pPVar2);
  if ((_Base_ptr)local_68._32_8_ != (_Base_ptr)0x0) {
    (**(code **)(*(long *)(_Rb_tree_color *)local_68._32_8_ + 0x18))();
  }
  psVar1 = (string *)*local_78;
  std::__cxx11::string::string((string *)&local_a8,"animated_positions",(allocator *)local_68);
  XML::childOpt((XML *)&local_b0,psVar1);
  std::__cxx11::string::~string((string *)&local_a8);
  this_00 = &local_88->positions;
  if (local_b0.ptr == (XML *)0x0) {
    psVar1 = (string *)*local_78;
    std::__cxx11::string::string((string *)local_68,"positions",&local_79);
    XML::childOpt((XML *)local_70,psVar1);
    loadVec3ffArray(&local_a8,(XMLLoader *)xml,(Ref<embree::XML> *)local_70);
    std::
    vector<embree::vector_t<embree::Vec3fx,embree::aligned_allocator<embree::Vec3fx,16ul>>,std::allocator<embree::vector_t<embree::Vec3fx,embree::aligned_allocator<embree::Vec3fx,16ul>>>>
    ::emplace_back<embree::vector_t<embree::Vec3fx,embree::aligned_allocator<embree::Vec3fx,16ul>>>
              ((vector<embree::vector_t<embree::Vec3fx,embree::aligned_allocator<embree::Vec3fx,16ul>>,std::allocator<embree::vector_t<embree::Vec3fx,embree::aligned_allocator<embree::Vec3fx,16ul>>>>
                *)this_00,&local_a8);
    alignedFree(local_a8.items);
    local_a8.items = (Vec3fx *)0x0;
    local_a8.size_active = 0;
    local_a8.size_alloced = 0;
    if (local_70 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_70 + 0x18))();
    }
    std::__cxx11::string::~string((string *)local_68);
    if (local_b0.ptr != (XML *)0x0) goto LAB_0017557a;
  }
  else {
    for (uVar3 = 0;
        uVar3 < (ulong)((long)((local_b0.ptr)->children).
                              super__Vector_base<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)((local_b0.ptr)->children).
                              super__Vector_base<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 3); uVar3 = uVar3 + 1) {
      XML::child((XML *)local_68,(size_t)local_b0.ptr);
      loadVec3ffArray(&local_a8,(XMLLoader *)xml,(Ref<embree::XML> *)local_68);
      std::
      vector<embree::vector_t<embree::Vec3fx,embree::aligned_allocator<embree::Vec3fx,16ul>>,std::allocator<embree::vector_t<embree::Vec3fx,embree::aligned_allocator<embree::Vec3fx,16ul>>>>
      ::
      emplace_back<embree::vector_t<embree::Vec3fx,embree::aligned_allocator<embree::Vec3fx,16ul>>>
                ((vector<embree::vector_t<embree::Vec3fx,embree::aligned_allocator<embree::Vec3fx,16ul>>,std::allocator<embree::vector_t<embree::Vec3fx,embree::aligned_allocator<embree::Vec3fx,16ul>>>>
                  *)this_00,&local_a8);
      alignedFree(local_a8.items);
      local_a8.items = (Vec3fx *)0x0;
      local_a8.size_active = 0;
      local_a8.size_alloced = 0;
      if ((EVP_PKEY_CTX *)local_68._0_8_ != (EVP_PKEY_CTX *)0x0) {
        (**(code **)(*(long *)local_68._0_8_ + 0x18))();
      }
    }
LAB_0017557a:
    (*((local_b0.ptr)->super_RefCount)._vptr_RefCount[3])(local_b0.ptr);
  }
  psVar1 = (string *)*local_78;
  std::__cxx11::string::string((string *)&local_a8,"animated_normals",(allocator *)&local_b0);
  XML::childOpt((XML *)local_68,psVar1);
  std::__cxx11::string::~string((string *)&local_a8);
  if ((EVP_PKEY_CTX *)local_68._0_8_ == (EVP_PKEY_CTX *)0x0) {
    psVar1 = (string *)*local_78;
    std::__cxx11::string::string((string *)&local_a8,"normals",(allocator *)local_70);
    XML::childOpt((XML *)&local_b0,psVar1);
    std::__cxx11::string::~string((string *)&local_a8);
    sig = extraout_RDX;
    if (local_b0.ptr != (XML *)0x0) {
      loadVec3faArray((avector<Vec3fa> *)&local_a8,(XMLLoader *)xml,&local_b0);
      std::
      vector<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>,std::allocator<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>>
      ::
      emplace_back<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>
                ((vector<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>,std::allocator<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>>
                  *)&local_88->normals,
                 (vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_> *)
                 &local_a8);
      alignedFree(local_a8.items);
      sig = extraout_RDX_00;
      if (local_b0.ptr != (XML *)0x0) {
        (*((local_b0.ptr)->super_RefCount)._vptr_RefCount[3])();
        sig = extraout_RDX_01;
      }
    }
    pEVar4 = (EVP_PKEY_CTX *)local_68._0_8_;
    if ((EVP_PKEY_CTX *)local_68._0_8_ == (EVP_PKEY_CTX *)0x0) goto LAB_001756ee;
  }
  else {
    this_01 = &local_88->normals;
    for (uVar3 = 0; pEVar4 = (EVP_PKEY_CTX *)local_68._0_8_,
        uVar3 < (ulong)(*(long *)(local_68._0_8_ + 0x88) - *(long *)(local_68._0_8_ + 0x80) >> 3);
        uVar3 = uVar3 + 1) {
      XML::child((XML *)&local_b0,local_68._0_8_);
      loadVec3faArray((avector<Vec3fa> *)&local_a8,(XMLLoader *)xml,&local_b0);
      std::
      vector<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>,std::allocator<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>>
      ::
      emplace_back<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>
                ((vector<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>,std::allocator<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>>
                  *)this_01,
                 (vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_> *)
                 &local_a8);
      alignedFree(local_a8.items);
      local_a8.items = (Vec3fx *)0x0;
      local_a8.size_active = 0;
      local_a8.size_alloced = 0;
      if (local_b0.ptr != (XML *)0x0) {
        (*((local_b0.ptr)->super_RefCount)._vptr_RefCount[3])();
      }
    }
  }
  (**(code **)(*(long *)pEVar4 + 0x18))(pEVar4);
  sig = extraout_RDX_02;
  local_68._0_8_ = pEVar4;
LAB_001756ee:
  pPVar2 = local_88;
  SceneGraph::PointSetNode::verify(local_88,(EVP_PKEY_CTX *)local_68._0_8_,sig,siglen,in_R8,in_R9);
  *(PointSetNode **)local_38._M_p = pPVar2;
  (*(pPVar2->super_Node).super_RefCount._vptr_RefCount[2])(pPVar2);
  (*(pPVar2->super_Node).super_RefCount._vptr_RefCount[3])(pPVar2);
  if ((_Base_ptr)local_68._40_8_ != (_Base_ptr)0x0) {
    (**(code **)(*(long *)local_68._40_8_ + 0x18))();
  }
  return (Ref<embree::SceneGraph::Node>)(Node *)local_38._M_p;
}

Assistant:

Ref<SceneGraph::Node> XMLLoader::loadPoints(const Ref<XML>& xml, RTCGeometryType type)
  {
    Ref<SceneGraph::MaterialNode> material = loadMaterial(xml->child("material"));
    Ref<SceneGraph::PointSetNode> mesh = new SceneGraph::PointSetNode(type,material,BBox1f(0,1),0);

    if (Ref<XML> animation = xml->childOpt("animated_positions")) {
      for (size_t i=0; i<animation->size(); i++) {
        mesh->positions.push_back(loadVec3ffArray(animation->child(i)));
      }
    } else {
      mesh->positions.push_back(loadVec3ffArray(xml->childOpt("positions")));
    }

    if (Ref<XML> animation = xml->childOpt("animated_normals")) {
      for (size_t i=0; i<animation->size(); i++) {
        mesh->normals.push_back(loadVec3faArray(animation->child(i)));
      }
    } else if (Ref<XML> normals = xml->childOpt("normals")) {
      mesh->normals.push_back(loadVec3faArray(normals));
    }

    mesh->verify();
    return mesh.dynamicCast<SceneGraph::Node>();
  }